

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

bool __thiscall miniros::TransportTCP::setNonBlocking(TransportTCP *this)

{
  uint uVar1;
  bool bVar2;
  allocator<char> local_49;
  string local_48;
  
  bVar2 = true;
  if ((this->flags_ & 1) == 0) {
    uVar1 = set_non_blocking(&this->sock_);
    if (uVar1 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setNonBlocking::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"miniros.transport_tcp",&local_49);
        console::initializeLogLocation(&setNonBlocking::loc,&local_48,Error);
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (setNonBlocking::loc.level_ != Error) {
        console::setLogLocationLevel(&setNonBlocking::loc,Error);
        console::checkLogLocationEnabled(&setNonBlocking::loc);
      }
      if (setNonBlocking::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,setNonBlocking::loc.logger_,setNonBlocking::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x56,"bool miniros::TransportTCP::setNonBlocking()",
                       "setting socket [%d] as non_blocking failed with error [%d]",
                       (ulong)(uint)this->sock_,(ulong)uVar1);
      }
      (*(this->super_Transport)._vptr_Transport[8])(this);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool TransportTCP::setNonBlocking()
{
  if (!(flags_ & SYNCHRONOUS))
  {
	  int result = set_non_blocking(sock_);
	  if ( result != 0 ) {
	      MINIROS_ERROR("setting socket [%d] as non_blocking failed with error [%d]", sock_, result);
      close();
      return false;
    }
  }

  return true;
}